

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O0

void __thiscall
spvtools::FriendlyNameMapper::SaveName(FriendlyNameMapper *this,uint32_t id,string *suggested_name)

{
  bool bVar1;
  mapped_type *this_00;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar3;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  local_108;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint local_b4;
  undefined1 local_b0 [4];
  uint32_t index;
  string base_name;
  undefined1 local_80 [8];
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  inserted;
  string name;
  string sanitized_suggested_name;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_28;
  string *local_20;
  string *suggested_name_local;
  FriendlyNameMapper *pFStack_10;
  uint32_t id_local;
  FriendlyNameMapper *this_local;
  
  local_20 = suggested_name;
  suggested_name_local._4_4_ = id;
  pFStack_10 = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->name_for_id_,(key_type *)((long)&suggested_name_local + 4));
  sanitized_suggested_name.field_2._8_8_ =
       std::
       unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->name_for_id_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      *)((long)&sanitized_suggested_name.field_2 + 8));
  if (!bVar1) {
    Sanitize((string *)(name.field_2._M_local_buf + 8),this,local_20);
    std::__cxx11::string::string
              ((string *)&inserted.second,(string *)(name.field_2._M_local_buf + 8));
    pVar3 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->used_names_,(value_type *)&inserted.second);
    base_name.field_2._8_8_ =
         pVar3.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    inserted.first.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur._0_1_ = pVar3.second;
    local_80 = (undefined1  [8])base_name.field_2._8_8_;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8),"_");
      local_b4 = 0;
      uVar2 = extraout_RDX;
      while ((((byte)inserted.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur ^ 0xff) & 1) != 0) {
        to_string_abi_cxx11_(&local_f8,(spvtools *)(ulong)local_b4,(uint32_t)uVar2);
        std::operator+(&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,&local_f8);
        std::__cxx11::string::operator=((string *)&inserted.second,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        pVar3 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&this->used_names_,(value_type *)&inserted.second);
        local_108.first =
             pVar3.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        local_108.second = pVar3.second;
        std::
        pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
        ::operator=((pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
                     *)local_80,&local_108);
        local_b4 = local_b4 + 1;
        uVar2 = extraout_RDX_00;
      }
      std::__cxx11::string::~string((string *)local_b0);
    }
    this_00 = std::
              unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->name_for_id_,(key_type *)((long)&suggested_name_local + 4));
    std::__cxx11::string::operator=((string *)this_00,(string *)&inserted.second);
    std::__cxx11::string::~string((string *)&inserted.second);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void FriendlyNameMapper::SaveName(uint32_t id,
                                  const std::string& suggested_name) {
  if (name_for_id_.find(id) != name_for_id_.end()) return;

  const std::string sanitized_suggested_name = Sanitize(suggested_name);
  std::string name = sanitized_suggested_name;
  auto inserted = used_names_.insert(name);
  if (!inserted.second) {
    const std::string base_name = sanitized_suggested_name + "_";
    for (uint32_t index = 0; !inserted.second; ++index) {
      name = base_name + to_string(index);
      inserted = used_names_.insert(name);
    }
  }
  name_for_id_[id] = name;
}